

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.h
# Opt level: O2

void puppup::movegen::makeMove(State *state,Rack *rack,Rack *population,Move *mov,Gaddag *gaddag)

{
  pointer pvVar1;
  long *plVar2;
  long lVar3;
  const_iterator __begin2;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  idx iVar7;
  
  lVar6 = mov->word;
  if (lVar6 != -1) {
    pvVar1 = (gaddag->words_).
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar7 = mov->step;
    plVar4 = *(long **)&pvVar1[lVar6].super__Vector_base<long,_std::allocator<long>_>._M_impl;
    plVar2 = *(pointer *)
              ((long)&pvVar1[lVar6].super__Vector_base<long,_std::allocator<long>_>._M_impl + 8);
    lVar6 = mov->cursor - ((long)plVar2 - (long)plVar4 >> 3) * iVar7;
    for (; plVar4 != plVar2; plVar4 = plVar4 + 1) {
      if ((state->board)._M_elems[lVar6] == 0x1b) {
        lVar3 = *plVar4;
        (state->board)._M_elems[lVar6] = lVar3;
        (state->letter_score)._M_elems[lVar6] = (&scores)[lVar3];
        rack->_M_elems[lVar3] = rack->_M_elems[lVar3] + -1;
        iVar7 = mov->step;
      }
      lVar6 = lVar6 + iVar7;
    }
    for (uVar5 = mov->blanks; uVar5 != 0; uVar5 = (long)uVar5 >> 0x10) {
      (state->letter_score)._M_elems[(uVar5 & 0xffff) - 1] = 0;
      rack->_M_elems[0x1a] = rack->_M_elems[0x1a] + -1;
      rack->_M_elems[(state->board)._M_elems[(uVar5 & 0xffff) - 1]] =
           rack->_M_elems[(state->board)._M_elems[(uVar5 & 0xffff) - 1]] + 1;
    }
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 1) {
      if (rack->_M_elems[lVar6] < 0) {
        population->_M_elems[lVar6] = population->_M_elems[lVar6] + rack->_M_elems[lVar6];
        rack->_M_elems[lVar6] = 0;
      }
    }
    state->score = state->score + mov->score;
  }
  return;
}

Assistant:

inline void makeMove(board::State& state, Rack& rack, Rack& population,
                     const Move& mov, const trie::Gaddag& gaddag) {
    if (mov.word == -1) {
        return;
    }
    const auto& s = gaddag.getStringFromWord(mov.word);
    idx cursor = mov.cursor - s.size() * mov.step;

    for (const chr c : s) {
        if (state.board[cursor] == emptiness) {
            state.board[cursor] = c;
            state.letter_score[cursor] = scores[c];
            rack[c]--;
        }
        cursor += mov.step;
    }
    idx blanks = mov.blanks;
    while (blanks) {
        idx blank_cursor = (blanks & idx(0xffffLL)) - 1;
        blanks >>= idx(16LL);
        state.letter_score[blank_cursor] = 0;
        --rack[blank];
        ++rack[state.board[blank_cursor]];
    }
    for (chr c = 0; c < 32; ++c) {
        if (rack[c] < 0) {
            population[c] += rack[c];
            rack[c] = 0;
        }
    }
    state.score += mov.score;
}